

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceL2LayerParams::InternalSwap
          (ReduceL2LayerParams *this,ReduceL2LayerParams *other)

{
  ReduceL2LayerParams *other_local;
  ReduceL2LayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  google::protobuf::internal::memswap<2>(&this->keepdims_,&other->keepdims_);
  return;
}

Assistant:

void ReduceL2LayerParams::InternalSwap(ReduceL2LayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axes_.InternalSwap(&other->axes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ReduceL2LayerParams, reduceall_)
      + sizeof(ReduceL2LayerParams::reduceall_)
      - PROTOBUF_FIELD_OFFSET(ReduceL2LayerParams, keepdims_)>(
          reinterpret_cast<char*>(&keepdims_),
          reinterpret_cast<char*>(&other->keepdims_));
}